

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

QList<QPainterPath> * anon_unknown.dwarf_d603ce::toSubpaths(QPainterPath *path)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  Element *e;
  int i;
  QList<QPainterPath> *subpaths;
  QPainterPath current;
  parameter_type in_stack_fffffffffffffef8;
  QList<QPainterPath> *in_stack_ffffffffffffff00;
  Element *in_stack_ffffffffffffff08;
  int i_00;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QPointF *this;
  int local_cc;
  QList<QPainterPath> local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->xp)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QList<QPainterPath>::QList((QList<QPainterPath> *)0x5d6f79);
  bVar1 = QPainterPath::isEmpty
                    ((QPainterPath *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (!bVar1) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)0x5d6fb7);
    local_cc = 0;
    while( true ) {
      i_00 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      iVar3 = local_cc;
      iVar2 = QPainterPath::elementCount((QPainterPath *)in_stack_ffffffffffffff00);
      if (iVar2 <= iVar3) break;
      in_stack_ffffffffffffff00 = &local_28;
      QPainterPath::elementAt((QPainterPath *)CONCAT44(iVar3,in_stack_ffffffffffffff10),i_00);
      in_stack_ffffffffffffff08 = (Element *)(ulong)(uint)(in_stack_ffffffffffffff00->d).size;
      switch(in_stack_ffffffffffffff08) {
      case (Element *)0x0:
        iVar3 = QPainterPath::elementCount((QPainterPath *)in_stack_ffffffffffffff00);
        if (1 < iVar3) {
          QList<QPainterPath>::operator+=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        }
        QPainterPath::QPainterPath((QPainterPath *)0x5d7071);
        QPainterPath::operator=((QPainterPath *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
        ;
        QPainterPath::~QPainterPath((QPainterPath *)0x5d7093);
        QPainterPath::Element::operator_cast_to_QPointF(in_stack_ffffffffffffff08);
        QPainterPath::moveTo((QPainterPath *)this,in_RDI);
        break;
      case (Element *)0x1:
        QPainterPath::Element::operator_cast_to_QPointF(in_stack_ffffffffffffff08);
        QPainterPath::lineTo((QPainterPath *)this,in_RDI);
        break;
      case (Element *)0x2:
        QPainterPath::Element::operator_cast_to_QPointF(in_stack_ffffffffffffff08);
        QPainterPath::elementAt
                  ((QPainterPath *)CONCAT44(iVar3,in_stack_ffffffffffffff10),
                   (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        QPainterPath::Element::operator_cast_to_QPointF(in_stack_ffffffffffffff08);
        QPainterPath::elementAt
                  ((QPainterPath *)CONCAT44(iVar3,in_stack_ffffffffffffff10),
                   (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        QPainterPath::Element::operator_cast_to_QPointF(in_stack_ffffffffffffff08);
        QPainterPath::cubicTo
                  ((QPainterPath *)this,in_RDI,(QPointF *)CONCAT44(iVar3,in_stack_ffffffffffffff10),
                   (QPointF *)in_stack_ffffffffffffff08);
        local_cc = local_cc + 2;
        break;
      case (Element *)0x3:
      }
      local_cc = local_cc + 1;
    }
    iVar3 = QPainterPath::elementCount((QPainterPath *)in_stack_ffffffffffffff00);
    if (1 < iVar3) {
      QList<QPainterPath>::operator<<(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    QPainterPath::~QPainterPath((QPainterPath *)0x5d7200);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QPainterPath> *)this;
  }
  __stack_chk_fail();
}

Assistant:

QList<QPainterPath> toSubpaths(const QPainterPath &path)
{

    QList<QPainterPath> subpaths;
    if (path.isEmpty())
        return subpaths;

    QPainterPath current;
    for (int i = 0; i < path.elementCount(); ++i) {
        const QPainterPath::Element &e = path.elementAt(i);
        switch (e.type) {
        case QPainterPath::MoveToElement:
            if (current.elementCount() > 1)
                subpaths += current;
            current = QPainterPath();
            current.moveTo(e);
            break;
        case QPainterPath::LineToElement:
            current.lineTo(e);
            break;
        case QPainterPath::CurveToElement: {
            current.cubicTo(e, path.elementAt(i + 1), path.elementAt(i + 2));
            i+=2;
            break;
        }
        case QPainterPath::CurveToDataElement:
            Q_ASSERT(!"toSubpaths(), bad element type");
            break;
        }
    }

    if (current.elementCount() > 1)
        subpaths << current;

    return subpaths;
}